

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O2

void __thiscall async_simple::Executor::~Executor(Executor *this)

{
  this->_vptr_Executor = (_func_int **)&PTR__Executor_001b06f0;
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

virtual ~Executor() {}